

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O3

void __thiscall dg::llvmdg::legacy::Function::dumpBlocks(Function *this,ostream *ostream)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->blocks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->blocks)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    Block::dumpNode(*(Block **)(p_Var1 + 1),ostream);
    std::__ostream_insert<char,std::char_traits<char>>(ostream,"\n",1);
  }
  return;
}

Assistant:

void Function::dumpBlocks(std::ostream &ostream) {
    for (auto *block : blocks) {
        block->dumpNode(ostream);
        ostream << "\n";
    }
}